

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::fixup_implicit_builtin_block_names
          (CompilerGLSL *this,ExecutionModel model)

{
  uint uVar1;
  ID IVar2;
  BuiltIn BVar3;
  size_t sVar4;
  Variant *pVVar5;
  long *plVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  StorageClass SVar12;
  SPIRVariable *var;
  SPIRType *pSVar13;
  Meta *pMVar14;
  ulong uVar15;
  TypedID<(spirv_cross::Types)0> *pTVar16;
  pointer pcVar17;
  Bitset flags;
  string local_b8;
  __node_base_ptr local_98;
  ExecutionModel local_8c;
  undefined1 local_88 [64];
  LoopLock local_48;
  ParsedIR *local_40;
  TypedID<(spirv_cross::Types)0> *local_38;
  
  local_40 = &(this->super_Compiler).ir;
  local_8c = model;
  ParsedIR::create_loop_hard_lock(local_40);
  sVar4 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar4 != 0) {
    pTVar16 = (this->super_Compiler).ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_38 = pTVar16 + sVar4;
    do {
      pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[pTVar16->id].type == TypeVariable) {
        var = Variant::get<spirv_cross::SPIRVariable>(pVVar5 + pTVar16->id);
        pSVar13 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(var->super_IVariant).field_0xc);
        bVar10 = Compiler::has_decoration
                           (&this->super_Compiler,(ID)(pSVar13->super_IVariant).self.id,
                            DecorationBlock);
        SVar12 = var->storage;
        if (((SVar12 | StorageClassUniform) == StorageClassOutput) && (bVar10)) {
          bVar11 = Compiler::is_builtin_variable(&this->super_Compiler,var);
          uVar8 = local_88._16_8_;
          if (bVar11) {
            if (local_8c == ExecutionModelMeshEXT) {
              Compiler::get_buffer_block_flags
                        ((Bitset *)local_88,&this->super_Compiler,
                         (VariableID)(var->super_IVariant).self.id);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = local_88._16_8_;
              uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1497)) % auVar7,0);
              if (*(long **)(local_88._8_8_ + (uVar15 & 0xffffffff) * 8) != (long *)0x0) {
                plVar6 = (long *)**(long **)(local_88._8_8_ + (uVar15 & 0xffffffff) * 8);
                uVar1 = *(uint *)(plVar6 + 1);
                do {
                  if (uVar1 == 0x1497) {
                    IVar2.id = (var->super_IVariant).self.id;
                    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                    local_98 = (__node_base_ptr)0x14;
                    local_b8._M_dataplus._M_p =
                         (pointer)::std::__cxx11::string::_M_create
                                            ((ulong *)&local_b8,(ulong)&local_98);
                    local_b8.field_2._M_allocated_capacity = (size_type)local_98;
                    *(undefined8 *)local_b8._M_dataplus._M_p = 0x506873654d5f6c67;
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 8) = 'r';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 9) = 'i';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 10) = 'm';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 0xb) = 'i';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 0xc) = 't';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 0xd) = 'i';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 0xe) = 'v';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 0xf) = 'e';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 0x10) = 's';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 0x11) = 'E';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 0x12) = 'X';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 0x13) = 'T';
                    local_b8._M_string_length = (size_type)local_98;
                    local_b8._M_dataplus._M_p[(long)local_98] = '\0';
                    Compiler::set_name(&this->super_Compiler,IVar2,&local_b8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                      operator_delete(local_b8._M_dataplus._M_p);
                    }
                    IVar2.id = (pSVar13->super_IVariant).self.id;
                    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                    local_98 = (__node_base_ptr)0x16;
                    local_b8._M_dataplus._M_p =
                         (pointer)::std::__cxx11::string::_M_create
                                            ((ulong *)&local_b8,(ulong)&local_98);
                    local_b8.field_2._M_allocated_capacity = (size_type)local_98;
                    *(undefined8 *)local_b8._M_dataplus._M_p = 0x506873654d5f6c67;
                    *(undefined8 *)((long)local_b8._M_dataplus._M_p + 8) = 0x74696d6972507265;
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 0xe) = 'i';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 0xf) = 't';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 0x10) = 'i';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 0x11) = 'v';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 0x12) = 'e';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 0x13) = 'E';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 0x14) = 'X';
                    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_b8._M_dataplus._M_p + 0x15) = 'T';
                    local_b8._M_string_length = (size_type)local_98;
                    local_b8._M_dataplus._M_p[(long)local_98] = '\0';
                    Compiler::set_name(&this->super_Compiler,IVar2,&local_b8);
                    goto LAB_0025cb01;
                  }
                  plVar6 = (long *)*plVar6;
                } while ((plVar6 != (long *)0x0) &&
                        (uVar1 = *(uint *)(plVar6 + 1),
                        (ulong)uVar1 % (ulong)local_88._16_8_ == uVar15));
              }
              IVar2.id = (var->super_IVariant).self.id;
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              local_98 = (__node_base_ptr)0x12;
              local_b8._M_dataplus._M_p =
                   (pointer)::std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
              local_b8.field_2._M_allocated_capacity = (size_type)local_98;
              *(undefined8 *)local_b8._M_dataplus._M_p = 0x566873654d5f6c67;
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p + 8) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p + 9) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p + 10) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p + 0xb) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p + 0xc) = 'c';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p + 0xd) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p + 0xe) = 's';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p + 0xf) = 'E';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p + 0x10) = 'X';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p + 0x11) = 'T';
              local_b8._M_string_length = (size_type)local_98;
              local_b8._M_dataplus._M_p[(long)local_98] = '\0';
              Compiler::set_name(&this->super_Compiler,IVar2,&local_b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p);
              }
              IVar2.id = (pSVar13->super_IVariant).self.id;
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              local_98 = (__node_base_ptr)0x13;
              local_b8._M_dataplus._M_p =
                   (pointer)::std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)&local_98);
              local_b8.field_2._M_allocated_capacity = (size_type)local_98;
              *(undefined8 *)local_b8._M_dataplus._M_p = 0x506873654d5f6c67;
              *(undefined8 *)((long)local_b8._M_dataplus._M_p + 8) = 0x7865747265567265;
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p + 0xf) = 'x';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p + 0x10) = 'E';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p + 0x11) = 'X';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p + 0x12) = 'T';
              local_b8._M_string_length = (size_type)local_98;
              local_b8._M_dataplus._M_p[(long)local_98] = '\0';
              Compiler::set_name(&this->super_Compiler,IVar2,&local_b8);
LAB_0025cb01:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p);
              }
              ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)(local_88 + 8));
              SVar12 = var->storage;
              goto LAB_0025cb26;
            }
            if (var->storage == StorageClassInput) {
              local_88._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x5;
              local_88._16_6_ = 0x6e695f6c67;
              local_88._0_8_ = local_88 + 0x10;
              Compiler::set_name(&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                                 (string *)local_88);
            }
            else {
              if (var->storage != StorageClassOutput) goto LAB_0025ccf1;
              local_88._16_6_ = 0x747500000000;
              local_88._16_4_ = 0x6f5f6c67;
              uVar9 = local_88._16_8_;
              local_88._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x6;
              local_88[0x17] = SUB81(uVar8,7);
              local_88._16_6_ = (undefined6)uVar9;
              local_88[0x16] = 0;
              local_88._0_8_ = local_88 + 0x10;
              Compiler::set_name(&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                                 (string *)local_88);
            }
            goto LAB_0025cce2;
          }
        }
        else {
LAB_0025cb26:
          pcVar17 = local_88 + 0x10;
          if (((!bVar10 && (SVar12 == StorageClassOutput && local_8c == ExecutionModelMeshEXT)) &&
              (pMVar14 = ParsedIR::find_meta(local_40,(ID)(var->super_IVariant).self.id),
              pMVar14 != (Meta *)0x0)) && ((pMVar14->decoration).builtin == true)) {
            BVar3 = (pMVar14->decoration).builtin_type;
            if (BVar3 == BuiltInPrimitiveTriangleIndicesEXT) {
              IVar2.id = (var->super_IVariant).self.id;
              local_b8._M_dataplus._M_p = (pointer)0x1e;
              local_88._0_8_ = pcVar17;
              local_88._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_88,(ulong)&local_b8)
              ;
              local_88._16_8_ = local_b8._M_dataplus._M_p;
              builtin_strncpy((char *)local_88._0_8_,"gl_PrimitiveTriangleIndicesEXT",0x1e);
              local_88._8_8_ = local_b8._M_dataplus._M_p;
              *(char *)(local_88._0_8_ + (long)local_b8._M_dataplus._M_p) = '\0';
              Compiler::set_name(&this->super_Compiler,IVar2,(string *)local_88);
            }
            else if (BVar3 == BuiltInPrimitiveLineIndicesEXT) {
              IVar2.id = (var->super_IVariant).self.id;
              local_b8._M_dataplus._M_p = (pointer)0x1a;
              local_88._0_8_ = pcVar17;
              local_88._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_88,(ulong)&local_b8)
              ;
              local_88._16_8_ = local_b8._M_dataplus._M_p;
              builtin_strncpy((char *)local_88._0_8_,"gl_PrimitiveLineIndicesEXT",0x1a);
              local_88._8_8_ = local_b8._M_dataplus._M_p;
              *(char *)(local_88._0_8_ + (long)local_b8._M_dataplus._M_p) = '\0';
              Compiler::set_name(&this->super_Compiler,IVar2,(string *)local_88);
            }
            else {
              if (BVar3 != BuiltInPrimitivePointIndicesEXT) goto LAB_0025ccf1;
              IVar2.id = (var->super_IVariant).self.id;
              local_b8._M_dataplus._M_p = (pointer)0x1b;
              local_88._0_8_ = pcVar17;
              local_88._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_88,(ulong)&local_b8)
              ;
              local_88._16_8_ = local_b8._M_dataplus._M_p;
              builtin_strncpy((char *)local_88._0_8_,"gl_PrimitivePointIndicesEXT",0x1b);
              local_88._8_8_ = local_b8._M_dataplus._M_p;
              *(char *)(local_88._0_8_ + (long)local_b8._M_dataplus._M_p) = '\0';
              Compiler::set_name(&this->super_Compiler,IVar2,(string *)local_88);
            }
LAB_0025cce2:
            if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
              operator_delete((void *)local_88._0_8_);
            }
          }
        }
      }
LAB_0025ccf1:
      pTVar16 = pTVar16 + 1;
    } while (pTVar16 != local_38);
  }
  ParsedIR::LoopLock::~LoopLock(&local_48);
  return;
}

Assistant:

void CompilerGLSL::fixup_implicit_builtin_block_names(ExecutionModel model)
{
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		if ((var.storage == StorageClassOutput || var.storage == StorageClassInput) && block &&
		    is_builtin_variable(var))
		{
			if (model != ExecutionModelMeshEXT)
			{
				// Make sure the array has a supported name in the code.
				if (var.storage == StorageClassOutput)
					set_name(var.self, "gl_out");
				else if (var.storage == StorageClassInput)
					set_name(var.self, "gl_in");
			}
			else
			{
				auto flags = get_buffer_block_flags(var.self);
				if (flags.get(DecorationPerPrimitiveEXT))
				{
					set_name(var.self, "gl_MeshPrimitivesEXT");
					set_name(type.self, "gl_MeshPerPrimitiveEXT");
				}
				else
				{
					set_name(var.self, "gl_MeshVerticesEXT");
					set_name(type.self, "gl_MeshPerVertexEXT");
				}
			}
		}

		if (model == ExecutionModelMeshEXT && var.storage == StorageClassOutput && !block)
		{
			auto *m = ir.find_meta(var.self);
			if (m && m->decoration.builtin)
			{
				auto builtin_type = m->decoration.builtin_type;
				if (builtin_type == BuiltInPrimitivePointIndicesEXT)
					set_name(var.self, "gl_PrimitivePointIndicesEXT");
				else if (builtin_type == BuiltInPrimitiveLineIndicesEXT)
					set_name(var.self, "gl_PrimitiveLineIndicesEXT");
				else if (builtin_type == BuiltInPrimitiveTriangleIndicesEXT)
					set_name(var.self, "gl_PrimitiveTriangleIndicesEXT");
			}
		}
	});
}